

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O2

bool __thiscall lzham::lzcompressor::send_zlib_header(lzcompressor *this)

{
  byte_vec *this_00;
  void *pvVar1;
  bool bVar2;
  int iVar3;
  bool bVar4;
  uchar local_33;
  uchar local_32;
  uchar local_31;
  
  bVar4 = true;
  if (((this->m_params).m_lzham_compress_flags & 0x20) != 0) {
    this_00 = &this->m_comp_buf;
    bVar2 = vector<unsigned_char>::try_push_back(this_00,&local_31);
    if ((bVar2) && (bVar2 = vector<unsigned_char>::try_push_back(this_00,&local_32), bVar2)) {
      pvVar1 = (this->m_params).m_pSeed_bytes;
      if (pvVar1 != (void *)0x0) {
        lzham::adler32(pvVar1,(ulong)(this->m_params).m_num_seed_bytes,1);
        iVar3 = 4;
        do {
          bVar4 = iVar3 == 0;
          iVar3 = iVar3 + -1;
          if (bVar4) {
            return bVar4;
          }
          bVar2 = vector<unsigned_char>::try_push_back(this_00,&local_33);
        } while (bVar2);
      }
    }
    else {
      bVar4 = false;
    }
  }
  return bVar4;
}

Assistant:

bool lzcompressor::send_zlib_header()
   {
      if ((m_params.m_lzham_compress_flags & LZHAM_COMP_FLAG_WRITE_ZLIB_STREAM) == 0)
         return true;

      // set CM (method) and CINFO (dictionary size) fields
      int cmf = LZHAM_Z_LZHAM | ((m_params.m_dict_size_log2 - 15) << 4);

      // set FLEVEL by mapping LZHAM's compression level to zlib's
      int flg = 0;
      switch (m_params.m_compression_level)
      {
         case LZHAM_COMP_LEVEL_FASTEST:
         {
            flg = 0 << 6;
            break;
         }
         case LZHAM_COMP_LEVEL_FASTER:
         {
            flg = 1 << 6;
            break;
         }
         case LZHAM_COMP_LEVEL_DEFAULT:
         case LZHAM_COMP_LEVEL_BETTER:
         {
            flg = 2 << 6;
            break;
         }
         default:
         {
            flg = 3 << 6;
            break;
         }
      }

      // set FDICT flag
      if (m_params.m_pSeed_bytes)
         flg |= 32;

      int check = ((cmf << 8) + flg) % 31;
      if (check)
         flg += (31 - check);

      LZHAM_ASSERT(0 == (((cmf << 8) + flg) % 31));
      if (!m_comp_buf.try_push_back(static_cast<uint8>(cmf)))
         return false;
      if (!m_comp_buf.try_push_back(static_cast<uint8>(flg)))
         return false;

      if (m_params.m_pSeed_bytes)
      {
         // send adler32 of DICT
         uint dict_adler32 = adler32(m_params.m_pSeed_bytes, m_params.m_num_seed_bytes);
         for (uint i = 0; i < 4; i++)
         {
            if (!m_comp_buf.try_push_back(static_cast<uint8>(dict_adler32 >> 24)))
               return false;
            dict_adler32 <<= 8;
         }
      }

      return true;
   }